

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# owning_string_map.hpp
# Opt level: O0

mapped_type * __thiscall
duckdb::
OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
::GetOrCreate(OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
              *this,key_type k)

{
  value_type entry_00;
  bool bVar1;
  pointer ppVar2;
  unsigned_long in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_duckdb::string_t,_unsigned_long>_>,_bool> result;
  iterator entry;
  map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>
  *in_stack_ffffffffffffff48;
  string_t *in_stack_ffffffffffffff50;
  pair<duckdb::string_t,_unsigned_long> local_70;
  pair<const_duckdb::string_t,_unsigned_long> local_58;
  OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
  *in_stack_ffffffffffffffc0;
  _Self local_30;
  _Self local_28;
  unsigned_long *local_8;
  
  local_28._M_node =
       (_Base_ptr)
       std::
       map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>
       ::find(in_stack_ffffffffffffff48,(key_type *)0xba253d);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>
       ::end(in_stack_ffffffffffffff48);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_duckdb::string_t,_unsigned_long>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_duckdb::string_t,_unsigned_long>_> *)
                        in_stack_ffffffffffffff50);
  }
  else {
    std::make_pair<duckdb::string_t&,unsigned_long>
              (in_stack_ffffffffffffff50,(unsigned_long *)in_stack_ffffffffffffff48);
    std::pair<const_duckdb::string_t,_unsigned_long>::pair<duckdb::string_t,_unsigned_long,_true>
              (&local_58,&local_70);
    entry_00.first.value.pointer.ptr = (char *)in_RSI;
    entry_00.first.value._0_8_ = in_RDI;
    entry_00.second = in_RDX;
    insert(in_stack_ffffffffffffffc0,entry_00);
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_duckdb::string_t,_unsigned_long>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_duckdb::string_t,_unsigned_long>_> *)
                        local_58.first.value.pointer.ptr);
  }
  local_8 = &ppVar2->second;
  return local_8;
}

Assistant:

mapped_type &GetOrCreate(key_type k) {
		auto entry = map.find(k);
		if (entry != map.end()) {
			return entry->second;
		}
		auto result = insert(make_pair(k, mapped_type()));
		return result.first->second;
	}